

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

Integer pnga_locate_num_blocks(Integer g_a,Integer *lo,Integer *hi)

{
  long lVar1;
  short sVar2;
  global_array_t *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Integer IVar7;
  Integer thi [7];
  Integer tlo [7];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  lVar1 = g_a + 1000;
  sVar2 = GA[lVar1].ndim;
  pgVar3 = GA;
  if (0 < (long)sVar2) {
    lVar6 = 0;
    do {
      if (((lo[lVar6] < 1) || (hi[lVar6] < lo[lVar6])) ||
         (pgVar3[g_a + 1000].dims[lVar6] < hi[lVar6])) {
        pnga_error("Requested region out of bounds",0);
        pgVar3 = GA;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pgVar3[lVar1].ndim);
  }
  if (pgVar3[lVar1].distr_type == 0) {
    IVar7 = -1;
  }
  else {
    lVar1 = pgVar3[lVar1].block_total;
    if (lVar1 < 1) {
      IVar7 = 0;
    }
    else {
      lVar6 = 0;
      IVar7 = 0;
      do {
        pnga_distribution(g_a,lVar6,local_68,local_a8);
        lVar4 = 1;
        if (0 < sVar2) {
          lVar5 = 0;
          do {
            if (((local_68[lVar5] < lo[lVar5]) || (hi[lVar5] < local_68[lVar5])) &&
               ((local_a8[lVar5] < lo[lVar5] || (hi[lVar5] < local_a8[lVar5])))) {
              lVar4 = 0;
              break;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < sVar2);
        }
        IVar7 = IVar7 + lVar4;
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar1);
    }
  }
  return IVar7;
}

Assistant:

Integer pnga_locate_num_blocks(Integer g_a, Integer *lo, Integer *hi)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer ndim = GA[ga_handle].ndim;
  Integer ret = -1, d;
  Integer cnt;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))
      pnga_error("Requested region out of bounds",0);

  if (GA[ga_handle].distr_type != REGULAR) {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, i, j, tlo[MAXDIM], thi[MAXDIM];
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }

      if (chk) {
        cnt++;
      }
    }
    ret = cnt;
  }

  return ret;
}